

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O3

void pybind11::detail::all_type_info_populate
               (PyTypeObject *t,
               vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
               *bases)

{
  pointer *ppptVar1;
  long *plVar2;
  iterator __position;
  _typeobject *p_Var3;
  size_t sVar4;
  internals *piVar5;
  const_iterator cVar6;
  type_info **pptVar7;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range5;
  long lVar8;
  char **ppcVar9;
  long *plVar10;
  _Hashtable<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  long lVar11;
  ulong uVar12;
  type_info *tinfo;
  vector<_typeobject_*,_std::allocator<_typeobject_*>_> check;
  _typeobject *type;
  handle local_70;
  _typeobject **local_68;
  iterator iStack_60;
  _typeobject **local_58;
  handle local_48;
  _Hashtable<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  _typeobject *local_38;
  
  local_68 = (_typeobject **)0x0;
  iStack_60._M_current = (_typeobject **)0x0;
  local_58 = (_typeobject **)0x0;
  local_48.m_ptr = t->tp_bases;
  if ((_typeobject *)local_48.m_ptr != (_typeobject *)0x0) {
    (((_typeobject *)local_48.m_ptr)->ob_base).ob_base.ob_refcnt =
         (((_typeobject *)local_48.m_ptr)->ob_base).ob_base.ob_refcnt + 1;
  }
  ppcVar9 = &((_typeobject *)local_48.m_ptr)->tp_name;
  if ((((((_typeobject *)local_48.m_ptr)->ob_base).ob_base.ob_type)->tp_flags & 0x2000000) != 0) {
    ppcVar9 = (char **)*ppcVar9;
  }
  lVar11 = (((_typeobject *)local_48.m_ptr)->ob_base).ob_size;
  if (lVar11 != 0) {
    lVar8 = 0;
    do {
      local_70.m_ptr = *(PyObject **)((long)ppcVar9 + lVar8);
      if (iStack_60._M_current == local_58) {
        std::vector<_typeobject*,std::allocator<_typeobject*>>::_M_realloc_insert<_typeobject*>
                  ((vector<_typeobject*,std::allocator<_typeobject*>> *)&local_68,iStack_60,
                   (_typeobject **)&local_70);
      }
      else {
        *iStack_60._M_current = (_typeobject *)local_70.m_ptr;
        iStack_60._M_current = iStack_60._M_current + 1;
      }
      lVar8 = lVar8 + 8;
    } while (lVar11 << 3 != lVar8);
  }
  object::~object((object *)&local_48);
  piVar5 = get_internals();
  if (iStack_60._M_current != local_68) {
    this = &(piVar5->registered_types_py)._M_h;
    uVar12 = 0;
    local_40 = this;
    do {
      local_48.m_ptr = (PyObject *)local_68[uVar12];
      if ((((((_typeobject *)local_48.m_ptr)->ob_base).ob_base.ob_type)->tp_flags & 0x80000000) != 0
         ) {
        cVar6 = std::
                _Hashtable<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(this,(key_type *)&local_48);
        if (cVar6.
            super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          p_Var3 = (_typeobject *)local_48.m_ptr[0x15].ob_refcnt;
          if (p_Var3 != (_typeobject *)0x0) {
            if (uVar12 + 1 == (long)iStack_60._M_current - (long)local_68 >> 3) {
              iStack_60._M_current = iStack_60._M_current + -1;
              uVar12 = uVar12 - 1;
            }
            (p_Var3->ob_base).ob_base.ob_refcnt =
                 (Py_ssize_t)
                 ((long)&(((PyTypeObject *)(p_Var3->ob_base).ob_base.ob_refcnt)->ob_base).ob_base.
                         ob_refcnt + 1);
            ppcVar9 = &p_Var3->tp_name;
            if ((((p_Var3->ob_base).ob_base.ob_type)->tp_flags & 0x2000000) != 0) {
              ppcVar9 = (char **)*ppcVar9;
            }
            sVar4 = (p_Var3->ob_base).ob_size;
            local_70.m_ptr = (PyObject *)p_Var3;
            if (sVar4 != 0) {
              lVar11 = 0;
              do {
                local_38 = *(_typeobject **)((long)ppcVar9 + lVar11);
                if (iStack_60._M_current == local_58) {
                  std::vector<_typeobject*,std::allocator<_typeobject*>>::
                  _M_realloc_insert<_typeobject*>
                            ((vector<_typeobject*,std::allocator<_typeobject*>> *)&local_68,
                             iStack_60,&local_38);
                }
                else {
                  *iStack_60._M_current = local_38;
                  iStack_60._M_current = iStack_60._M_current + 1;
                }
                lVar11 = lVar11 + 8;
              } while (sVar4 << 3 != lVar11);
            }
            object::~object((object *)&local_70);
            this = local_40;
          }
        }
        else {
          plVar2 = *(long **)((long)cVar6.
                                    super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                    ._M_cur + 0x18);
          for (plVar10 = *(long **)((long)cVar6.
                                          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                          ._M_cur + 0x10); plVar10 != plVar2; plVar10 = plVar10 + 1)
          {
            local_70.m_ptr = (PyObject *)*plVar10;
            __position._M_current =
                 (bases->
                 super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            for (pptVar7 = (bases->
                           super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                pptVar7 != __position._M_current; pptVar7 = pptVar7 + 1) {
              if ((_typeobject *)*pptVar7 == (_typeobject *)local_70.m_ptr) goto LAB_0010bd01;
            }
            if (__position._M_current ==
                (bases->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>
              ::_M_realloc_insert<pybind11::detail::type_info*const&>
                        ((vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>
                          *)bases,__position,(type_info **)&local_70);
            }
            else {
              *__position._M_current = (type_info *)local_70.m_ptr;
              ppptVar1 = &(bases->
                          super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *ppptVar1 = *ppptVar1 + 1;
            }
LAB_0010bd01:
          }
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)iStack_60._M_current - (long)local_68 >> 3));
  }
  if (local_68 != (_typeobject **)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return;
}

Assistant:

PYBIND11_NOINLINE void all_type_info_populate(PyTypeObject *t, std::vector<type_info *> &bases) {
    std::vector<PyTypeObject *> check;
    for (handle parent : reinterpret_borrow<tuple>(t->tp_bases)) {
        check.push_back((PyTypeObject *) parent.ptr());
    }

    auto const &type_dict = get_internals().registered_types_py;
    for (size_t i = 0; i < check.size(); i++) {
        auto *type = check[i];
        // Ignore Python2 old-style class super type:
        if (!PyType_Check((PyObject *) type)) {
            continue;
        }

        // Check `type` in the current set of registered python types:
        auto it = type_dict.find(type);
        if (it != type_dict.end()) {
            // We found a cache entry for it, so it's either pybind-registered or has pre-computed
            // pybind bases, but we have to make sure we haven't already seen the type(s) before:
            // we want to follow Python/virtual C++ rules that there should only be one instance of
            // a common base.
            for (auto *tinfo : it->second) {
                // NB: Could use a second set here, rather than doing a linear search, but since
                // having a large number of immediate pybind11-registered types seems fairly
                // unlikely, that probably isn't worthwhile.
                bool found = false;
                for (auto *known : bases) {
                    if (known == tinfo) {
                        found = true;
                        break;
                    }
                }
                if (!found) {
                    bases.push_back(tinfo);
                }
            }
        } else if (type->tp_bases) {
            // It's some python type, so keep follow its bases classes to look for one or more
            // registered types
            if (i + 1 == check.size()) {
                // When we're at the end, we can pop off the current element to avoid growing
                // `check` when adding just one base (which is typical--i.e. when there is no
                // multiple inheritance)
                check.pop_back();
                i--;
            }
            for (handle parent : reinterpret_borrow<tuple>(type->tp_bases)) {
                check.push_back((PyTypeObject *) parent.ptr());
            }
        }
    }
}